

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

void ZSTD_freeCCtxContent(ZSTD_CCtx *cctx)

{
  void *ptr;
  ZSTD_customMem customMem;
  
  ZSTD_customFree((cctx->localDict).dictBuffer,cctx->customMem);
  ZSTD_freeCDict((cctx->localDict).cdict);
  (cctx->localDict).dictBuffer = (void *)0x0;
  (cctx->localDict).dict = (void *)0x0;
  (cctx->localDict).dictSize = 0;
  *(undefined8 *)&(cctx->localDict).dictContentType = 0;
  (cctx->localDict).cdict = (ZSTD_CDict *)0x0;
  cctx->cdict = (ZSTD_CDict *)0x0;
  (cctx->prefixDict).dict = (void *)0x0;
  (cctx->prefixDict).dictSize = 0;
  *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
  customMem = cctx->customMem;
  ptr = (cctx->workspace).workspace;
  (cctx->workspace).objectEnd = (void *)0x0;
  (cctx->workspace).tableEnd = (void *)0x0;
  (cctx->workspace).tableValidEnd = (void *)0x0;
  (cctx->workspace).allocStart = (void *)0x0;
  (cctx->workspace).allocFailed = '\0';
  *(undefined3 *)&(cctx->workspace).field_0x31 = 0;
  (cctx->workspace).workspaceOversizedDuration = 0;
  (cctx->workspace).phase = ZSTD_cwksp_alloc_objects;
  (cctx->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
  (cctx->workspace).workspace = (void *)0x0;
  (cctx->workspace).workspaceEnd = (void *)0x0;
  ZSTD_customFree(ptr,customMem);
  return;
}

Assistant:

static void ZSTD_freeCCtxContent(ZSTD_CCtx* cctx)
{
    assert(cctx != NULL);
    assert(cctx->staticSize == 0);
    ZSTD_clearAllDicts(cctx);
#ifdef ZSTD_MULTITHREAD
    ZSTDMT_freeCCtx(cctx->mtctx); cctx->mtctx = NULL;
#endif
    ZSTD_cwksp_free(&cctx->workspace, cctx->customMem);
}